

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

int mbedtls_ecp_copy(mbedtls_ecp_point *P,mbedtls_ecp_point *Q)

{
  int local_1c;
  int ret;
  mbedtls_ecp_point *Q_local;
  mbedtls_ecp_point *P_local;
  
  local_1c = mbedtls_mpi_copy(&P->X,&Q->X);
  if ((local_1c == 0) && (local_1c = mbedtls_mpi_copy(&P->Y,&Q->Y), local_1c == 0)) {
    local_1c = mbedtls_mpi_copy(&P->Z,&Q->Z);
  }
  return local_1c;
}

Assistant:

int mbedtls_ecp_copy(mbedtls_ecp_point *P, const mbedtls_ecp_point *Q)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&P->X, &Q->X));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&P->Y, &Q->Y));
    MBEDTLS_MPI_CHK(mbedtls_mpi_copy(&P->Z, &Q->Z));

cleanup:
    return ret;
}